

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.h
# Opt level: O0

QDir * QDir::current(void)

{
  QDir *in_RDI;
  long in_FS_OFFSET;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QDir::currentPath();
  QDir::QDir(in_RDI,(QString *)local_20);
  QString::~QString((QString *)0x13e740);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static inline QDir current() { return QDir(currentPath()); }